

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditional_entropy.c
# Opt level: O0

double inform_conditional_entropy(int *xs,int *ys,size_t n,int bx,int by,inform_error *err)

{
  _Bool _Var1;
  int *piVar2;
  double ce;
  inform_dist *xy;
  inform_dist *x;
  inform_error *err_local;
  int by_local;
  int bx_local;
  size_t n_local;
  int *ys_local;
  int *xs_local;
  
  x = (inform_dist *)err;
  err_local._0_4_ = by;
  err_local._4_4_ = bx;
  _by_local = n;
  n_local = (size_t)ys;
  ys_local = xs;
  _Var1 = check_arguments(xs,ys,n,bx,by,err);
  if (_Var1) {
    xs_local = (int *)0x7ff8000000000000;
  }
  else {
    xy = (inform_dist *)0x0;
    ce = 0.0;
    _Var1 = allocate(err_local._4_4_,(int)err_local,&xy,(inform_dist **)&ce,(inform_error *)x);
    if (_Var1) {
      xs_local = (int *)0x7ff8000000000000;
    }
    else {
      accumulate(ys_local,(int *)n_local,_by_local,(int)err_local,xy,(inform_dist *)ce);
      piVar2 = (int *)inform_shannon_ce((inform_dist *)ce,xy,2.0);
      free_all(&xy,(inform_dist **)&ce);
      xs_local = piVar2;
    }
  }
  return (double)xs_local;
}

Assistant:

double inform_conditional_entropy(int const *xs, int const *ys, size_t n,
    int bx, int by, inform_error *err)
{
    if (check_arguments(xs, ys, n, bx, by, err)) return NAN;

    inform_dist *x = NULL, *xy = NULL;
    if (allocate(bx, by, &x, &xy, err)) return NAN;

    accumulate(xs, ys, n, by, x, xy);

    double ce = inform_shannon_ce(xy, x, 2.0);

    free_all(&x, &xy);

    return ce;
}